

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O2

sexp sexp_length_op(sexp ctx,sexp self,sexp_sint_t n,sexp ls1)

{
  sexp psVar1;
  long lVar2;
  ulong uVar3;
  sexp psVar4;
  
  if ((((ulong)ls1 & 3) != 0) || (ls1->tag != 6)) {
    return (sexp)&DAT_00000001;
  }
  lVar2 = 1;
  uVar3 = 0;
  psVar4 = ls1;
  do {
    psVar1 = (psVar4->value).type.cpl;
    if (((ulong)psVar1 & 3) != 0) {
LAB_0010e894:
      return (sexp)((uVar3 + lVar2) * 2 + 1);
    }
    if (((psVar1->tag != 6) || (psVar4 = (psVar1->value).type.cpl, ((ulong)psVar4 & 3) != 0)) ||
       (psVar4->tag != 6)) {
      uVar3 = (ulong)(psVar1->tag == 6);
      goto LAB_0010e894;
    }
    if (ls1 == psVar1) {
      return (sexp)&DAT_0000003e;
    }
    lVar2 = lVar2 + 2;
    ls1 = (ls1->value).type.cpl;
  } while( true );
}

Assistant:

sexp sexp_length_op (sexp ctx, sexp self, sexp_sint_t n, sexp ls1) {
  sexp ls2;
  sexp_uint_t res = 1;
  if (!sexp_pairp(ls1))
    return SEXP_ZERO;
  for (ls2=sexp_cdr(ls1); sexp_pairp(ls2) && sexp_pairp(sexp_cdr(ls2));
       res+=2, ls1=sexp_cdr(ls1), ls2=sexp_cddr(ls2))
    if (ls1 == ls2)
      return SEXP_FALSE;
  return sexp_make_fixnum(res + (sexp_pairp(ls2) ? 1 : 0));
}